

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_visuals.cxx
# Opt level: O2

void __thiscall xray_re::xr_visual_object::~xr_visual_object(xr_visual_object *this)

{
  (this->super_xr_custom_object)._vptr_xr_custom_object =
       (_func_int **)&PTR__xr_visual_object_0023a178;
  std::__cxx11::string::~string((string *)&this->m_reference);
  xr_custom_object::~xr_custom_object(&this->super_xr_custom_object);
  return;
}

Assistant:

void xr_visual_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(SCENEOBJ_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == SCENEOBJ_VERSION_16 || version == SCENEOBJ_VERSION);

	if (version == SCENEOBJ_VERSION_16) {
		if (!r.find_chunk(SCENEOBJ_CHUNK_PLACEMENT))
			xr_not_expected();
		r.r_fvector3(co_position());
		r.r_fvector3(co_rotation());
		r.r_fvector3(co_scale());
		r.debug_find_chunk();
	}

	xr_custom_object::load(r);

	if (!r.find_chunk(SCENEOBJ_CHUNK_REFERENCE))
		xr_not_expected();
	m_file_version = r.r_u32();
	r.r_u32();
	r.r_sz(m_reference);
	r.debug_find_chunk();

	r.r_chunk<uint32_t>(SCENEOBJ_CHUNK_FLAGS, m_flags);
}